

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O1

void __thiscall AviWriter::useFrame(AviWriter *this,avi_frame_t *frame)

{
  iterator *piVar1;
  _Elt_pointer ppAVar2;
  int64_t *piVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  AVIIndexRecord *indexRecord;
  AVIIndexRecord *local_28;
  
  if (frame->type == 'A') {
    piVar3 = &this->fPrevAudioPts;
    uVar6 = 0x62773130;
    if ((this->fPrevAudioPts != 0) &&
       (uVar4 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)((int)frame->pts - (int)this->fPrevAudioPts)),
       this->fAudioMaxBytesPerSecond < uVar4)) {
      this->fAudioMaxBytesPerSecond = uVar4;
    }
    lVar7 = 0;
  }
  else {
    piVar3 = &this->fPrevVideoPts;
    uVar6 = 0x63643030;
    lVar7 = 4;
    if ((this->fPrevVideoPts != 0) &&
       (uVar4 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)((int)frame->pts - (int)this->fPrevVideoPts)),
       this->fVideoMaxBytesPerSecond < uVar4)) {
      this->fVideoMaxBytesPerSecond = uVar4;
    }
  }
  *piVar3 = frame->pts;
  local_28 = (AVIIndexRecord *)operator_new(0x10);
  local_28->fChunkId = uVar6;
  local_28->fFlags = (uint)(frame->data[lVar7] == 'g') << 4;
  local_28->fOffset = this->fNumBytesWritten + 4;
  local_28->fSize = frame->size;
  ppAVar2 = (this->indexRecords).c.
            super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar2 ==
      (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>>::
    _M_push_back_aux<AVIIndexRecord*const&>
              ((deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>> *)&this->indexRecords,
               &local_28);
  }
  else {
    *ppAVar2 = local_28;
    piVar1 = &(this->indexRecords).c.
              super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  addWord(this,uVar6);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  addWord(this,frame->size);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  fwrite(frame->data,1,(long)frame->size,(FILE *)this->fOutFid);
  uVar6 = frame->size;
  this->fNumBytesWritten = this->fNumBytesWritten + uVar6;
  if ((uVar6 & 1) == 0) {
    putc(0,(FILE *)this->fOutFid);
    this->fNumBytesWritten = this->fNumBytesWritten + 1;
  }
  puVar5 = &this->fNumAudioFrames;
  if (frame->type != 'A') {
    puVar5 = &this->fNumVideoFrames;
  }
  *puVar5 = *puVar5 + 1;
  return;
}

Assistant:

void AviWriter::useFrame(const avi_frame_t &frame)
{
    if (frame.type == AVI_AUDIO_FRAME) {
        if (fPrevAudioPts) {
            int uSecondsDiff = frame.pts - fPrevAudioPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fAudioMaxBytesPerSecond)
                fAudioMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevAudioPts = frame.pts;
    } else {
        if (fPrevVideoPts) {
            int uSecondsDiff = frame.pts - fPrevVideoPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fVideoMaxBytesPerSecond)
                fVideoMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevVideoPts = frame.pts;
    }

    unsigned subsessionTag = (frame.type == AVI_AUDIO_FRAME ? fourChar('0', '1', 'w', 'b') : fourChar('0', '0', 'd', 'c'));

    auto indexRecord = new AVIIndexRecord;

    indexRecord->fChunkId = subsessionTag;
    int testIndex = (frame.type == AVI_AUDIO_FRAME ? 0 : 4);
    indexRecord->fFlags = frame.data[testIndex] == 0x67 ? 0x10 : 0;
    indexRecord->fOffset = 4 + fNumBytesWritten; // riff chunk header offset from movi chunk start (4 = movi)
    indexRecord->fSize = frame.size; // chunk size excluding riff header size (only frame data)

    indexRecords.push(indexRecord);

    fNumBytesWritten += addWord(subsessionTag);
    fNumBytesWritten += addWord(frame.size);

    fwrite(frame.data, 1, frame.size, fOutFid);
    fNumBytesWritten += frame.size;

    // Pad to an even length:

    if (frame.size % 2 == 0)
        fNumBytesWritten += addByte(0);

    (frame.type == AVI_AUDIO_FRAME ? fNumAudioFrames : fNumVideoFrames)++;
}